

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_dispatch_test.cc
# Opt level: O1

void __thiscall
ImplDispatchTest_AEAD_AES_GCM_Test::TestBody(ImplDispatchTest_AEAD_AES_GCM_Test *this)

{
  bool bVar1;
  bool bVar2;
  initializer_list<std::pair<unsigned_long,_bool>_> __l;
  allocator_type local_d1;
  vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_> local_d0;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  pair<unsigned_long,_bool> local_90;
  undefined8 local_80;
  byte local_78;
  undefined8 local_70;
  byte local_68;
  undefined8 local_60;
  byte local_58;
  undefined8 local_50;
  byte local_48;
  undefined8 local_40;
  byte local_38;
  undefined8 local_30;
  byte local_28;
  undefined8 local_20;
  byte local_18;
  
  local_78 = (this->super_ImplDispatchTest).aesni_;
  bVar1 = (this->super_ImplDispatchTest).is_x86_64_;
  bVar2 = (this->super_ImplDispatchTest).vaes_;
  local_58 = bVar2 ^ 1;
  local_90.second = (bool)1;
  if ((bVar1 & 1U) != 0) {
    local_90.second = (bool)local_58;
  }
  local_28 = 0;
  if ((bool)local_78 == false) {
    local_90.second = (bool)local_28;
  }
  local_90.first = 0;
  local_80 = 1;
  local_70 = 3;
  if (((this->super_ImplDispatchTest).avx_movbe_ & 1U) == 0) {
    local_58 = 0;
  }
  if ((local_78 & 1) == 0) {
    local_58 = local_28;
  }
  if ((bVar1 & 1U) == 0) {
    local_58 = local_28;
  }
  local_60 = 2;
  local_48 = local_78 ^ 1;
  if ((this->super_ImplDispatchTest).ssse3_ == false) {
    local_48 = 0;
  }
  local_50 = 4;
  local_40 = 5;
  if ((bVar1 & 1U) != 0) {
    if ((bVar2 & 1U) == 0) {
      local_28 = 0;
    }
    else {
      local_28 = 1;
      if ((this->super_ImplDispatchTest).avx512_ != false) {
        local_28 = (this->super_ImplDispatchTest).avoid_zmm_;
      }
    }
  }
  local_30 = 6;
  if ((((bVar1 & 1U) == 0) || ((bVar2 & 1U) == 0)) ||
     ((this->super_ImplDispatchTest).avx512_ != true)) {
    local_18 = 0;
  }
  else {
    local_18 = (this->super_ImplDispatchTest).avoid_zmm_ ^ 1;
  }
  local_20 = 7;
  __l._M_len = 8;
  __l._M_array = &local_90;
  local_68 = local_78;
  local_38 = local_48;
  std::vector<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>::
  vector(&local_d0,__l,&local_d1);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/impl_dispatch_test.cc:116:7)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/impl_dispatch_test.cc:116:7)>
             ::_M_manager;
  ImplDispatchTest::AssertFunctionsHit
            (&this->super_ImplDispatchTest,&local_d0,(function<void_()> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  if (local_d0.
      super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.
                    super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.
                          super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.
                          super__Vector_base<std::pair<unsigned_long,_bool>,_std::allocator<std::pair<unsigned_long,_bool>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST_F(ImplDispatchTest, AEAD_AES_GCM) {
  AssertFunctionsHit(
      {
          {kFlag_aes_hw_ctr32_encrypt_blocks, aesni_ && !(is_x86_64_ && vaes_)},
          {kFlag_aes_hw_encrypt, aesni_},
          {kFlag_aes_hw_set_encrypt_key, aesni_},
          {kFlag_aesni_gcm_encrypt,
           is_x86_64_ && aesni_ && avx_movbe_ && !vaes_},
          {kFlag_vpaes_encrypt, ssse3_ && !aesni_},
          {kFlag_vpaes_set_encrypt_key, ssse3_ && !aesni_},
          {kFlag_aes_gcm_enc_update_vaes_avx2,
           is_x86_64_ && vaes_ && !(avx512_ && !avoid_zmm_)},
          {kFlag_aes_gcm_enc_update_vaes_avx512,
           is_x86_64_ && vaes_ && avx512_ && !avoid_zmm_},
      },
      [] {
        const uint8_t kZeros[16] = {0};
        const uint8_t kPlaintext[40] = {1, 2, 3, 4, 0};
        uint8_t ciphertext[sizeof(kPlaintext) + 16];
        size_t ciphertext_len;
        bssl::ScopedEVP_AEAD_CTX ctx;
        ASSERT_TRUE(EVP_AEAD_CTX_init(ctx.get(), EVP_aead_aes_128_gcm(), kZeros,
                                      sizeof(kZeros),
                                      EVP_AEAD_DEFAULT_TAG_LENGTH, nullptr));
        ASSERT_TRUE(EVP_AEAD_CTX_seal(
            ctx.get(), ciphertext, &ciphertext_len, sizeof(ciphertext), kZeros,
            EVP_AEAD_nonce_length(EVP_aead_aes_128_gcm()), kPlaintext,
            sizeof(kPlaintext), nullptr, 0));
      });
}